

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void __thiscall wallet::coinselector_tests::bump_fee_test::test_method(bump_fee_test *this)

{
  bool bVar1;
  size_type sVar2;
  SelectionResult *pSVar3;
  long in_FS_OFFSET;
  size_t i_1;
  CAmount changeless_target;
  size_t i;
  CAmount target;
  CAmount fee_diff;
  CAmount change_fee;
  CAmount change_cost;
  CAmount min_viable_change;
  CAmount fee;
  CAmount expected_waste_1;
  vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  inputs_1;
  CAmount expected_waste;
  vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  inputs;
  SelectionResult selection_1;
  SelectionResult selection;
  char *in_stack_fffffffffffffc28;
  lazy_ostream *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  COutput *in_stack_fffffffffffffc50;
  lazy_ostream *in_stack_fffffffffffffc58;
  const_string *in_stack_fffffffffffffc60;
  const_string *file;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  SelectionResult *in_stack_fffffffffffffc70;
  CAmount in_stack_fffffffffffffc78;
  SelectionResult *in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  int nInput;
  ulong uVar4;
  SelectionResult *in_stack_fffffffffffffc90;
  ulong local_310;
  ulong local_2f8;
  COutput *local_2a8;
  CAmount in_stack_fffffffffffffd60;
  undefined1 local_290 [64];
  lazy_ostream local_250;
  undefined1 local_238 [64];
  undefined8 local_1f8 [4];
  undefined8 local_1d8;
  undefined8 local_1d0;
  lazy_ostream local_1c8;
  undefined1 local_1b0 [64];
  lazy_ostream local_170;
  undefined1 local_158 [64];
  undefined8 local_118 [4];
  undefined8 local_f8;
  undefined8 local_f0;
  SelectionResult local_e8 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffffc38,(CAmount)in_stack_fffffffffffffc30,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffffc28 >> 0x38));
  local_f0 = 100000000;
  add_coin((CAmount *)in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
           in_stack_fffffffffffffc80,in_stack_fffffffffffffd60,in_stack_fffffffffffffc78);
  local_f8 = 200000000;
  add_coin((CAmount *)in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
           in_stack_fffffffffffffc80,in_stack_fffffffffffffd60,in_stack_fffffffffffffc78);
  SelectionResult::GetShuffledInputVector(in_stack_fffffffffffffc90);
  local_2f8 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            ::size((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                    *)in_stack_fffffffffffffc28);
    if (sVar2 <= local_2f8) break;
    std::
    vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>::
    operator[]((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                *)in_stack_fffffffffffffc38,(size_type)in_stack_fffffffffffffc30);
    std::__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffc28);
    COutput::ApplyBumpFee
              (in_stack_fffffffffffffc50,
               CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    local_2f8 = local_2f8 + 1;
  }
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffffc70,CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68)
             ,(CAmount)in_stack_fffffffffffffc60,(CAmount)in_stack_fffffffffffffc58);
  local_118[0] = 0x69;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
               in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58,
               (const_string *)in_stack_fffffffffffffc50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc30,(char (*) [1])in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    local_170._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc38 = "selection.GetWaste()";
    in_stack_fffffffffffffc30 = &local_170;
    in_stack_fffffffffffffc28 = "expected_waste";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_158,&local_170.m_empty,0x403,1,2,local_118);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SelectionResult::SetBumpFeeDiscount
            ((SelectionResult *)in_stack_fffffffffffffc38,(CAmount)in_stack_fffffffffffffc30);
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffffc70,CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68)
             ,(CAmount)in_stack_fffffffffffffc60,(CAmount)in_stack_fffffffffffffc58);
  local_118[0] = 0x4b;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
               in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58,
               (const_string *)in_stack_fffffffffffffc50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc30,(char (*) [1])in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    local_1c8._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc38 = "selection.GetWaste()";
    in_stack_fffffffffffffc30 = &local_1c8;
    in_stack_fffffffffffffc28 = "expected_waste";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1b0,&local_1c8.m_empty,0x408,1,2,local_118);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    nInput = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
  } while (bVar1);
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~vector((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
             *)in_stack_fffffffffffffc38);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffffc28);
  pSVar3 = local_e8;
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffffc38,(CAmount)in_stack_fffffffffffffc30,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffffc28 >> 0x38));
  local_1d0 = 100000000;
  add_coin((CAmount *)pSVar3,nInput,in_stack_fffffffffffffc80,in_stack_fffffffffffffd60,
           in_stack_fffffffffffffc78);
  local_1d8 = 200000000;
  add_coin((CAmount *)pSVar3,nInput,in_stack_fffffffffffffc80,in_stack_fffffffffffffd60,
           in_stack_fffffffffffffc78);
  SelectionResult::GetShuffledInputVector(pSVar3);
  local_310 = 0;
  while( true ) {
    uVar4 = local_310;
    sVar2 = std::
            vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            ::size((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                    *)in_stack_fffffffffffffc28);
    if (sVar2 <= uVar4) break;
    std::
    vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>::
    operator[]((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                *)in_stack_fffffffffffffc38,(size_type)in_stack_fffffffffffffc30);
    std::__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffc28);
    COutput::ApplyBumpFee
              (in_stack_fffffffffffffc50,
               CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    local_310 = local_310 + 1;
  }
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffffc70,CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68)
             ,(CAmount)in_stack_fffffffffffffc60,(CAmount)in_stack_fffffffffffffc58);
  local_1f8[0] = 0x14;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
               in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58,
               (const_string *)in_stack_fffffffffffffc50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc30,(char (*) [1])in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    pSVar3 = (SelectionResult *)
             SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc38 = "selection.GetWaste()";
    in_stack_fffffffffffffc30 = &local_250;
    in_stack_fffffffffffffc28 = "expected_waste";
    local_250._vptr_lazy_ostream = (_func_int **)pSVar3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_238,&local_250.m_empty,0x41d,1,2,local_1f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc6f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc6f);
  SelectionResult::SetBumpFeeDiscount
            ((SelectionResult *)in_stack_fffffffffffffc38,(CAmount)in_stack_fffffffffffffc30);
  SelectionResult::RecalculateWaste
            (pSVar3,CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (CAmount)in_stack_fffffffffffffc60,(CAmount)in_stack_fffffffffffffc58);
  local_1f8[0] = 0x14;
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),file
               ,(size_t)in_stack_fffffffffffffc58,(const_string *)in_stack_fffffffffffffc50);
    in_stack_fffffffffffffc58 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc30,(char (*) [1])in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)in_stack_fffffffffffffc30,(unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc50 =
         (COutput *)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc38 = "selection.GetWaste()";
    in_stack_fffffffffffffc30 = (lazy_ostream *)&local_2a8;
    in_stack_fffffffffffffc28 = "expected_waste";
    local_2a8 = in_stack_fffffffffffffc50;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_290,&stack0xfffffffffffffd60,0x422,1,2,local_1f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~vector((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
             *)in_stack_fffffffffffffc38);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffffc28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bump_fee_test)
{
    const CAmount fee{100};
    const CAmount min_viable_change{200};
    const CAmount change_cost{125};
    const CAmount change_fee{35};
    const CAmount fee_diff{40};
    const CAmount target{2 * COIN};

    {
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, /*fee=*/fee, /*long_term_fee=*/fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        const std::vector<std::shared_ptr<COutput>> inputs = selection.GetShuffledInputVector();

        for (size_t i = 0; i < inputs.size(); ++i) {
            inputs[i]->ApplyBumpFee(20*(i+1));
        }

        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        CAmount expected_waste = fee_diff * -2 + change_cost + /*bump_fees=*/60;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());

        selection.SetBumpFeeDiscount(30);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        expected_waste = fee_diff * -2 + change_cost + /*bump_fees=*/60 - /*group_discount=*/30;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());
    }

    {
        // Test with changeless transaction
        //
        // Bump fees and excess both contribute fully to the waste score,
        // therefore, a bump fee group discount will not change the waste
        // score as long as we do not create change in both instances.
        CAmount changeless_target = 3 * COIN - 2 * fee - 100;
        SelectionResult selection{changeless_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, /*fee=*/fee, /*long_term_fee=*/fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        const std::vector<std::shared_ptr<COutput>> inputs = selection.GetShuffledInputVector();

        for (size_t i = 0; i < inputs.size(); ++i) {
            inputs[i]->ApplyBumpFee(20*(i+1));
        }

        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        CAmount expected_waste = fee_diff * -2 + /*bump_fees=*/60 + /*excess = 100 - bump_fees*/40;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());

        selection.SetBumpFeeDiscount(30);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        expected_waste = fee_diff * -2 + /*bump_fees=*/60 - /*group_discount=*/30 + /*excess = 100 - bump_fees + group_discount*/70;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());
    }
}